

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O0

float deqp::gles2::Functional::triQuadInterpolate(float x,float y,Vec4 *quad)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vec4 *quad_local;
  float y_local;
  float x_local;
  
  if (1.0 <= x + y) {
    fVar1 = tcu::Vector<float,_4>::w(quad);
    fVar2 = tcu::Vector<float,_4>::z(quad);
    fVar3 = tcu::Vector<float,_4>::y(quad);
    y_local = triangleInterpolate(fVar1,fVar2,fVar3,1.0 - x,1.0 - y);
  }
  else {
    fVar1 = tcu::Vector<float,_4>::x(quad);
    fVar2 = tcu::Vector<float,_4>::y(quad);
    fVar3 = tcu::Vector<float,_4>::z(quad);
    y_local = triangleInterpolate(fVar1,fVar2,fVar3,x,y);
  }
  return y_local;
}

Assistant:

inline float triQuadInterpolate (const float x, const float y, const tcu::Vec4& quad)
{
	// \note Top left fill rule.
	if (x + y < 1.0f)
		return triangleInterpolate(quad.x(), quad.y(), quad.z(), x, y);
	else
		return triangleInterpolate(quad.w(), quad.z(), quad.y(), 1.0f-x, 1.0f-y);
}